

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemTxResult
flatview_write_continue
          (uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,MemTxAttrs attrs,void *ptr,hwaddr len,
          hwaddr addr1,hwaddr l,MemoryRegion_conflict *mr)

{
  hwaddr addr_00;
  MemoryRegion_conflict *mr_00;
  _Bool _Var1;
  int sz;
  MemOp op;
  MemTxResult MVar2;
  uint64_t data;
  void *__dest;
  bool bVar3;
  void *local_58;
  uint8_t *buf;
  _Bool release_lock;
  MemTxResult result;
  uint64_t val;
  uint8_t *ram_ptr;
  hwaddr len_local;
  void *ptr_local;
  hwaddr addr_local;
  FlatView *fv_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  buf._4_4_ = 0;
  bVar3 = false;
  local_58 = ptr;
  ram_ptr = (uint8_t *)len;
  ptr_local = (void *)addr;
  while( true ) {
    _Var1 = memory_access_is_direct(mr,true);
    if (_Var1) {
      __dest = qemu_ram_ptr_length((uc_struct_conflict15 *)fv->root->uc,mr->ram_block,addr1,&l,false
                                  );
      memcpy(__dest,local_58,l);
    }
    else {
      _Var1 = prepare_mmio_access(mr);
      bVar3 = bVar3 || _Var1;
      sz = memory_access_size(mr,(uint)l,addr1);
      l = (hwaddr)sz;
      data = ldn_he_p(local_58,sz);
      mr_00 = mr;
      addr_00 = addr1;
      op = size_memop((uint)l);
      MVar2 = memory_region_dispatch_write_tricore(uc,mr_00,addr_00,data,op,attrs);
      buf._4_4_ = MVar2 | buf._4_4_;
    }
    if (bVar3) {
      bVar3 = false;
    }
    ram_ptr = ram_ptr + -l;
    local_58 = (void *)(l + (long)local_58);
    ptr_local = (void *)(l + (long)ptr_local);
    if (ram_ptr == (uint8_t *)0x0) break;
    l = (hwaddr)ram_ptr;
    mr = flatview_translate_tricore(uc,fv,(hwaddr)ptr_local,&addr1,&l,true,attrs);
  }
  return buf._4_4_;
}

Assistant:

static MemTxResult flatview_write_continue(struct uc_struct *uc, FlatView *fv, hwaddr addr,
                                           MemTxAttrs attrs,
                                           const void *ptr,
                                           hwaddr len, hwaddr addr1,
                                           hwaddr l, MemoryRegion *mr)
{
    uint8_t *ram_ptr;
    uint64_t val;
    MemTxResult result = MEMTX_OK;
    bool release_lock = false;
    const uint8_t *buf = ptr;

    for (;;) {
        if (!memory_access_is_direct(mr, true)) {
            release_lock |= prepare_mmio_access(mr);
            l = memory_access_size(mr, l, addr1);
            /* XXX: could force current_cpu to NULL to avoid
               potential bugs */
            val = ldn_he_p(buf, l);
            result |= memory_region_dispatch_write(uc, mr, addr1, val,
                                                   size_memop(l), attrs);
        } else {
            /* RAM case */
            ram_ptr = qemu_ram_ptr_length(fv->root->uc, mr->ram_block, addr1, &l, false);
            memcpy(ram_ptr, buf, l);
        }

        if (release_lock) {
            release_lock = false;
        }

        len -= l;
        buf += l;
        addr += l;

        if (!len) {
            break;
        }

        l = len;
        mr = flatview_translate(uc, fv, addr, &addr1, &l, true, attrs);
    }

    return result;
}